

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O0

int boost::report_errors(void)

{
  int iVar1;
  report_errors_reminder *prVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  int local_c;
  int errors;
  
  prVar2 = detail::report_errors_remind();
  prVar2->called_report_errors_function = true;
  piVar3 = detail::test_errors();
  iVar1 = *piVar3;
  if (iVar1 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"No errors detected.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_c = 0;
  }
  else {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    poVar4 = std::operator<<(poVar4," error");
    pcVar5 = "s";
    if (iVar1 == 1) {
      pcVar5 = "";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," detected.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_c = 1;
  }
  return local_c;
}

Assistant:

inline int report_errors()
{
    boost::detail::report_errors_remind().called_report_errors_function = true;

    int errors = boost::detail::test_errors();

    if( errors == 0 )
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
          << "No errors detected." << std::endl;
        return 0;
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
          << errors << " error" << (errors == 1? "": "s") << " detected." << std::endl;
        return 1;
    }
}